

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O0

SUNMemory SUNMemoryHelper_Wrap(void *ptr,SUNMemoryType mem_type)

{
  undefined4 in_ESI;
  void *in_RDI;
  SUNMemory mem;
  SUNMemory local_8;
  
  local_8 = SUNMemoryNewEmpty();
  local_8->ptr = in_RDI;
  local_8->own = 0;
  switch(in_ESI) {
  case 0:
    local_8->type = SUNMEMTYPE_HOST;
    break;
  case 1:
    local_8->type = SUNMEMTYPE_PINNED;
    break;
  case 2:
    local_8->type = SUNMEMTYPE_DEVICE;
    break;
  case 3:
    local_8->type = SUNMEMTYPE_UVM;
    break;
  default:
    free(local_8);
    local_8 = (SUNMemory)0x0;
  }
  return local_8;
}

Assistant:

SUNMemory SUNMemoryHelper_Wrap(void* ptr, SUNMemoryType mem_type)
{
  SUNMemory mem = SUNMemoryNewEmpty();

  mem->ptr = ptr;
  mem->own = SUNFALSE;

  switch(mem_type)
  {
    case SUNMEMTYPE_HOST:
      mem->type = SUNMEMTYPE_HOST;
      break;
    case SUNMEMTYPE_PINNED:
      mem->type = SUNMEMTYPE_PINNED;
      break;
    case SUNMEMTYPE_DEVICE:
      mem->type = SUNMEMTYPE_DEVICE;
      break;
    case SUNMEMTYPE_UVM:
      mem->type = SUNMEMTYPE_UVM;
      break;
    default:
      free(mem);
      SUNDIALS_DEBUG_PRINT("ERROR in SUNMemoryHelper_Wrap: unknown memory type\n");
      return(NULL);
  }

  return(mem);
}